

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LY_ERR lyd_unlink_leafref_node(lyd_node_term *node,lyd_node_term *leafref_node)

{
  uint16_t uVar1;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_b0;
  ulong local_a0;
  long local_90;
  long local_88;
  long local_80;
  long local_68;
  ulong local_58;
  ly_ctx *local_48;
  ulong local_40;
  uint64_t index___1;
  uint64_t index__;
  lyd_leafref_links_rec *rec;
  lyd_node_term *plStack_20;
  LY_ERR ret;
  lyd_node_term *leafref_node_local;
  lyd_node_term *node_local;
  
  plStack_20 = leafref_node;
  leafref_node_local = node;
  if (node == (lyd_node_term *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                  ,0xea6,
                  "LY_ERR lyd_unlink_leafref_node(const struct lyd_node_term *, const struct lyd_node_term *)"
                 );
  }
  if (leafref_node == (lyd_node_term *)0x0) {
    __assert_fail("leafref_node",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                  ,0xea7,
                  "LY_ERR lyd_unlink_leafref_node(const struct lyd_node_term *, const struct lyd_node_term *)"
                 );
  }
  if ((node->field_0).node.schema == (lysc_node *)0x0) {
    local_48 = (ly_ctx *)node[1].field_0.node.next;
  }
  else {
    local_48 = ((node->field_0).node.schema)->module->ctx;
  }
  uVar1 = ly_ctx_get_options(local_48);
  if ((uVar1 & 0x400) == 0) {
    node_local._4_4_ = LY_EDENIED;
  }
  else {
    rec._4_4_ = lyd_get_or_create_leafref_links_record
                          (leafref_node_local,(lyd_leafref_links_rec **)&index__,'\0');
    if (rec._4_4_ == LY_SUCCESS) {
      index___1 = 0;
      while( true ) {
        if (*(long *)(index__ + 8) == 0) {
          local_58 = 0;
        }
        else {
          local_58 = *(ulong *)(*(long *)(index__ + 8) + -8);
        }
        if (local_58 <= index___1) goto LAB_00133e69;
        if (*(lyd_node_term **)(*(long *)(index__ + 8) + index___1 * 8) == plStack_20) break;
        index___1 = index___1 + 1;
      }
      if (*(long *)(index__ + 8) == 0) {
        local_68 = 0;
      }
      else {
        local_68 = *(long *)(*(long *)(index__ + 8) + -8);
      }
      if (index___1 != local_68 - 1U) {
        if (*(long *)(index__ + 8) == 0) {
          local_80 = 0;
        }
        else {
          local_80 = *(long *)(*(long *)(index__ + 8) + -8);
        }
        *(undefined8 *)(*(long *)(index__ + 8) + index___1 * 8) =
             *(undefined8 *)(*(long *)(index__ + 8) + (local_80 + -1) * 8);
      }
      *(long *)(*(long *)(index__ + 8) + -8) = *(long *)(*(long *)(index__ + 8) + -8) + -1;
LAB_00133e69:
      if (*(long *)(index__ + 8) == 0) {
        local_88 = 0;
      }
      else {
        local_88 = *(long *)(*(long *)(index__ + 8) + -8);
      }
      if (local_88 == 0) {
        if (*(long *)(index__ + 0x10) == 0) {
          local_90 = 0;
        }
        else {
          local_90 = *(long *)(*(long *)(index__ + 0x10) + -8);
        }
        if (local_90 == 0) {
          lyd_free_leafref_nodes(leafref_node_local);
        }
      }
    }
    else if (rec._4_4_ != LY_ENOTFOUND) {
      return rec._4_4_;
    }
    rec._4_4_ = lyd_get_or_create_leafref_links_record
                          (plStack_20,(lyd_leafref_links_rec **)&index__,'\0');
    if (rec._4_4_ == LY_SUCCESS) {
      local_40 = 0;
      while( true ) {
        if (*(long *)(index__ + 0x10) == 0) {
          local_a0 = 0;
        }
        else {
          local_a0 = *(ulong *)(*(long *)(index__ + 0x10) + -8);
        }
        if (local_a0 <= local_40) goto LAB_00134069;
        if (*(lyd_node_term **)(*(long *)(index__ + 0x10) + local_40 * 8) == leafref_node_local)
        break;
        local_40 = local_40 + 1;
      }
      if (*(long *)(index__ + 0x10) == 0) {
        local_b0 = 0;
      }
      else {
        local_b0 = *(long *)(*(long *)(index__ + 0x10) + -8);
      }
      if (local_40 != local_b0 - 1U) {
        if (*(long *)(index__ + 0x10) == 0) {
          local_c8 = 0;
        }
        else {
          local_c8 = *(long *)(*(long *)(index__ + 0x10) + -8);
        }
        *(undefined8 *)(*(long *)(index__ + 0x10) + local_40 * 8) =
             *(undefined8 *)(*(long *)(index__ + 0x10) + (local_c8 + -1) * 8);
      }
      *(long *)(*(long *)(index__ + 0x10) + -8) = *(long *)(*(long *)(index__ + 0x10) + -8) + -1;
LAB_00134069:
      if (*(long *)(index__ + 8) == 0) {
        local_d0 = 0;
      }
      else {
        local_d0 = *(long *)(*(long *)(index__ + 8) + -8);
      }
      if (local_d0 == 0) {
        if (*(long *)(index__ + 0x10) == 0) {
          local_d8 = 0;
        }
        else {
          local_d8 = *(long *)(*(long *)(index__ + 0x10) + -8);
        }
        if (local_d8 == 0) {
          lyd_free_leafref_nodes(plStack_20);
        }
      }
    }
    else if (rec._4_4_ != LY_ENOTFOUND) {
      return rec._4_4_;
    }
    node_local._4_4_ = LY_SUCCESS;
  }
  return node_local._4_4_;
}

Assistant:

LY_ERR
lyd_unlink_leafref_node(const struct lyd_node_term *node, const struct lyd_node_term *leafref_node)
{
    LY_ERR ret;
    struct lyd_leafref_links_rec *rec;

    assert(node);
    assert(leafref_node);

    if (!(ly_ctx_get_options(LYD_CTX(node)) & LY_CTX_LEAFREF_LINKING)) {
        return LY_EDENIED;
    }

    /* remove link from target node to leafref node */
    ret = lyd_get_or_create_leafref_links_record(node, &rec, 0);
    if (ret == LY_SUCCESS) {
        LY_ARRAY_REMOVE_VALUE(rec->leafref_nodes, leafref_node);
        if ((LY_ARRAY_COUNT(rec->leafref_nodes) == 0) && (LY_ARRAY_COUNT(rec->target_nodes) == 0)) {
            lyd_free_leafref_nodes(node);
        }
    } else if (ret != LY_ENOTFOUND) {
        return ret;
    }

    /* remove link from leafref node to target node */
    ret = lyd_get_or_create_leafref_links_record(leafref_node, &rec, 0);
    if (ret == LY_SUCCESS) {
        LY_ARRAY_REMOVE_VALUE(rec->target_nodes, node);
        if ((LY_ARRAY_COUNT(rec->leafref_nodes) == 0) && (LY_ARRAY_COUNT(rec->target_nodes) == 0)) {
            lyd_free_leafref_nodes(leafref_node);
        }
    } else if (ret != LY_ENOTFOUND) {
        return ret;
    }

    return LY_SUCCESS;
}